

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Table.cxx
# Opt level: O0

void __thiscall Fl_Table::cols(Fl_Table *this,int val)

{
  uint uVar1;
  int *piVar2;
  int local_2c;
  uint local_1c;
  int now_size;
  int default_w;
  int val_local;
  Fl_Table *this_local;
  
  this->_cols = val;
  uVar1 = IntVector::size(&this->_colwidths);
  if (uVar1 == 0) {
    local_2c = 0x50;
  }
  else {
    uVar1 = IntVector::size(&this->_colwidths);
    piVar2 = IntVector::operator[](&this->_colwidths,uVar1 - 1);
    local_2c = *piVar2;
  }
  local_1c = IntVector::size(&this->_colwidths);
  IntVector::size(&this->_colwidths,val);
  while ((int)local_1c < val) {
    piVar2 = IntVector::operator[](&this->_colwidths,local_1c);
    *piVar2 = local_2c;
    local_1c = local_1c + 1;
  }
  table_resized(this);
  Fl_Widget::redraw((Fl_Widget *)this);
  return;
}

Assistant:

void Fl_Table::cols(int val) {
  _cols = val;
  {
    int default_w = ( _colwidths.size() > 0 ) ? _colwidths[_colwidths.size()-1] : 80;
    int now_size = _colwidths.size();
    _colwidths.size(val);			// enlarge or shrink as needed
    while ( now_size < val ) {
      _colwidths[now_size++] = default_w;	// fill new
    }
  }
  table_resized();
  redraw();
}